

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O3

bool ImGui::ImageButton(ImTextureID user_texture_id,ImVec2 *size,ImVec2 *uv0,ImVec2 *uv1,
                       int frame_padding,ImVec4 *bg_col,ImVec4 *tint_col)

{
  ImGuiWindow *this;
  bool bVar1;
  ImGuiID id;
  ImVec2 local_38;
  
  this = GImGui->CurrentWindow;
  if (this->SkipItems == false) {
    PushID(user_texture_id);
    id = ImGuiWindow::GetID(this,"#image",(char *)0x0);
    PopID();
    if (frame_padding < 0) {
      bVar1 = ImageButtonEx(id,user_texture_id,size,uv0,uv1,bg_col,tint_col,0);
    }
    else {
      local_38.x = (float)frame_padding;
      local_38.y = local_38.x;
      PushStyleVar(0xb,&local_38);
      bVar1 = ImageButtonEx(id,user_texture_id,size,uv0,uv1,bg_col,tint_col,0);
      PopStyleVar(1);
    }
  }
  else {
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool ImGui::ImageButton(ImTextureID user_texture_id, const ImVec2& size, const ImVec2& uv0, const ImVec2& uv1, int frame_padding, const ImVec4& bg_col, const ImVec4& tint_col)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;
    if (window->SkipItems)
        return false;

    // Default to using texture ID as ID. User can still push string/integer prefixes.
    PushID((void*)(intptr_t)user_texture_id);
    const ImGuiID id = window->GetID("#image");
    PopID();

    if (frame_padding >= 0)
        PushStyleVar(ImGuiStyleVar_FramePadding, ImVec2((float)frame_padding, (float)frame_padding));
    bool ret = ImageButtonEx(id, user_texture_id, size, uv0, uv1, bg_col, tint_col);
    if (frame_padding >= 0)
        PopStyleVar();
    return ret;
}